

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFront.cpp
# Opt level: O2

void __thiscall TPZFront<float>::FreeGlobal(TPZFront<float> *this,int64_t global)

{
  long *plVar1;
  long lVar2;
  ostream *poVar3;
  
  plVar1 = (this->fLocal).fStore;
  lVar2 = plVar1[global];
  if (lVar2 != -1) {
    (this->fGlobal).super_TPZVec<long>.fStore[lVar2] = -1;
    plVar1[global] = -1;
    TPZStack<int,_10>::Push(&this->fFree,(int)lVar2);
    return;
  }
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "TPZFront FreeGlobal was called with wrong parameters !");
  std::endl<char,std::char_traits<char>>(poVar3);
  return;
}

Assistant:

void TPZFront<TVar>::FreeGlobal(int64_t global)
{
	if(fLocal[global]==-1){
		cout << "TPZFront FreeGlobal was called with wrong parameters !" << endl;
		return;
	}
	int64_t index;
	index=fLocal[global];
	fGlobal[index]=-1;
	fLocal[global]=-1;
	fFree.Push(index);
}